

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
* vkt::pipeline::anon_unknown_0::makeGraphicsPipelines
            (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
             *__return_storage_ptr__,DeviceInterface *vk,VkDevice device,deUint32 numSubpasses,
            VkPipelineLayout pipelineLayout,VkRenderPass renderPass,VkShaderModule vertexModule,
            VkShaderModule fragmentModule,IVec2 *renderSize,VkSampleCountFlagBits numSamples,
            VkPrimitiveTopology topology)

{
  Deleter<vk::Handle<(vk::HandleType)18>_> deleter;
  VkDevice pVVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 width;
  deUint32 height;
  VkResult result;
  ulong __n;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference pHVar8;
  Deleter<vk::Handle<(vk::HandleType)18>_> local_458;
  deUint64 local_440;
  Handle<(vk::HandleType)18> local_438;
  Move<vk::Handle<(vk::HandleType)18>_> local_430;
  value_type local_410;
  __normal_iterator<vk::Handle<(vk::HandleType)18>_*,_std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>_>
  local_400;
  __normal_iterator<vk::Handle<(vk::HandleType)18>_*,_std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>_>
  local_3f8;
  __normal_iterator<const_vk::Handle<(vk::HandleType)18>_*,_std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>_>
  local_3f0;
  const_iterator it;
  Handle<(vk::HandleType)15> local_3e0;
  uint local_3d4;
  undefined1 local_3d0 [4];
  deUint32 subpassNdx;
  VkGraphicsPipelineCreateInfo createInfo;
  VkPipelineCreateFlags firstPipelineFlags;
  undefined1 local_330 [8];
  vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
  rawPipelines;
  allocator<vk::VkGraphicsPipelineCreateInfo> local_301;
  undefined1 local_300 [8];
  vector<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
  graphicsPipelineInfos;
  VkPipelineShaderStageCreateInfo pShaderStages [2];
  undefined1 local_280 [8];
  VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  undefined1 local_220 [4];
  VkColorComponentFlags colorComponentsAll;
  VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo;
  deUint32 dStack_1b0;
  VkStencilOpState stencilOpState;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo;
  undefined1 local_120 [8];
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  VkRect2D scissor;
  VkViewport viewport;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  undefined8 local_50;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  deUint32 numSubpasses_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VkShaderModule fragmentModule_local;
  VkShaderModule vertexModule_local;
  VkRenderPass renderPass_local;
  VkPipelineLayout pipelineLayout_local;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  *pipelines;
  
  local_50 = 0x2000000000;
  vertexInputBindingDescription.binding = 0;
  vertexInputStateInfo.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  pipelineInputAssemblyStateInfo.primitiveRestartEnable = 0x13;
  vertexInputStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexInputStateInfo._4_4_ = 0;
  vertexInputStateInfo.pNext._0_4_ = 0;
  vertexInputStateInfo.pNext._4_4_ = 1;
  vertexInputStateInfo._16_8_ = &local_50;
  vertexInputStateInfo.pVertexBindingDescriptions._0_4_ = 2;
  vertexInputStateInfo._32_8_ = &vertexInputStateInfo.pVertexAttributeDescriptions;
  pipelineInputAssemblyStateInfo.flags = 0;
  pipelineInputAssemblyStateInfo.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  pipelineInputAssemblyStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineInputAssemblyStateInfo._4_4_ = 0;
  viewport.minDepth = 2.8026e-44;
  viewport.maxDepth = 0.0;
  pipelineInputAssemblyStateInfo.pNext = (void *)((ulong)topology << 0x20);
  vertexInputBindingDescription.stride = numSubpasses;
  unique0x10000af6 = device;
  iVar3 = tcu::Vector<int,_2>::x(renderSize);
  iVar4 = tcu::Vector<int,_2>::y(renderSize);
  ::vk::makeViewport((VkViewport *)&scissor.extent,0.0,0.0,(float)iVar3,(float)iVar4,0.0,1.0);
  pipelineViewportStateInfo.pScissors = (VkRect2D *)::vk::makeOffset2D(0,0);
  width = tcu::Vector<int,_2>::x(renderSize);
  height = tcu::Vector<int,_2>::y(renderSize);
  scissor.offset = (VkOffset2D)::vk::makeExtent2D(width,height);
  local_120._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  pipelineViewportStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineViewportStateInfo._4_4_ = 0;
  pipelineViewportStateInfo.pNext._0_4_ = 0;
  pipelineViewportStateInfo.pNext._4_4_ = 1;
  pipelineViewportStateInfo.pViewports._0_4_ = 1;
  pipelineViewportStateInfo._32_8_ = &pipelineViewportStateInfo.pScissors;
  pipelineMultisampleStateInfo.alphaToCoverageEnable = 0x17;
  pipelineMultisampleStateInfo.alphaToOneEnable = 0;
  pipelineMultisampleStateInfo.sampleShadingEnable = 0;
  pipelineMultisampleStateInfo.minSampleShading = 0.0;
  pipelineMultisampleStateInfo.pSampleMask = (VkSampleMask *)0x0;
  pipelineMultisampleStateInfo.flags = 0;
  pipelineMultisampleStateInfo.rasterizationSamples = 0;
  pipelineMultisampleStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineMultisampleStateInfo._4_4_ = 0;
  stencilOpState.writeMask = 0x18;
  stencilOpState.reference = 0;
  pipelineMultisampleStateInfo.pNext = (void *)((ulong)numSamples << 0x20);
  pipelineViewportStateInfo._16_8_ = &scissor.extent;
  ::vk::makeStencilOpState
            ((VkStencilOpState *)&pipelineDepthStencilStateInfo.maxDepthBounds,VK_STENCIL_OP_KEEP,
             VK_STENCIL_OP_KEEP,VK_STENCIL_OP_KEEP,VK_COMPARE_OP_ALWAYS,0,0,0);
  local_220 = (undefined1  [4])0x19;
  pipelineDepthStencilStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineDepthStencilStateInfo._4_4_ = 0;
  pipelineDepthStencilStateInfo.pNext._0_4_ = 0;
  pipelineDepthStencilStateInfo.pNext._4_4_ = 0;
  pipelineDepthStencilStateInfo.flags = 0;
  pipelineDepthStencilStateInfo.depthTestEnable = 1;
  pipelineDepthStencilStateInfo.depthWriteEnable = 0;
  pipelineDepthStencilStateInfo.depthCompareOp = VK_COMPARE_OP_NEVER;
  pipelineDepthStencilStateInfo.front.compareOp = stencilOpState.compareOp;
  pipelineDepthStencilStateInfo.front.compareMask = stencilOpState.compareMask;
  pipelineDepthStencilStateInfo.depthBoundsTestEnable =
       (VkBool32)pipelineDepthStencilStateInfo.maxDepthBounds;
  pipelineDepthStencilStateInfo.stencilTestEnable = dStack_1b0;
  pipelineDepthStencilStateInfo.back.compareOp = stencilOpState.compareOp;
  pipelineDepthStencilStateInfo.back.compareMask = stencilOpState.compareMask;
  pipelineDepthStencilStateInfo.front.writeMask =
       (deUint32)pipelineDepthStencilStateInfo.maxDepthBounds;
  pipelineDepthStencilStateInfo.front.reference = dStack_1b0;
  pipelineDepthStencilStateInfo.back.writeMask = 0;
  pipelineDepthStencilStateInfo.back.reference = 0x3f800000;
  pipelineColorBlendStateInfo.blendConstants[2] = 0.0;
  pipelineColorBlendStateInfo.blendConstants[3] = 1.4013e-45;
  local_280._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  pipelineColorBlendStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineColorBlendStateInfo._4_4_ = 0;
  pipelineColorBlendStateInfo.pNext._0_4_ = 0;
  pipelineColorBlendStateInfo.pNext._4_4_ = 0;
  pipelineColorBlendStateInfo.flags = 3;
  pipelineColorBlendStateInfo.logicOpEnable = 1;
  pipelineColorBlendStateInfo._24_8_ = pipelineColorBlendStateInfo.blendConstants + 2;
  pipelineColorBlendStateInfo.pAttachments._0_4_ = 0;
  pipelineColorBlendStateInfo.pAttachments._4_4_ = 0;
  pipelineColorBlendStateInfo.blendConstants[0] = 0.0;
  pipelineColorBlendStateInfo.blendConstants[1] = 0.0;
  graphicsPipelineInfos.
  super__Vector_base<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x12;
  std::allocator<vk::VkGraphicsPipelineCreateInfo>::allocator(&local_301);
  std::vector<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>::
  vector((vector<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
          *)local_300,0,&local_301);
  std::allocator<vk::VkGraphicsPipelineCreateInfo>::~allocator(&local_301);
  __n = (ulong)vertexInputBindingDescription.stride;
  ::vk::Handle<(vk::HandleType)18>::Handle((Handle<(vk::HandleType)18> *)&firstPipelineFlags,0);
  std::allocator<vk::Handle<(vk::HandleType)18>_>::allocator
            ((allocator<vk::Handle<(vk::HandleType)18>_> *)&createInfo.field_0x8f);
  std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>::
  vector((vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_> *
         )local_330,__n,(value_type *)&firstPipelineFlags,(allocator_type *)&createInfo.field_0x8f);
  std::allocator<vk::Handle<(vk::HandleType)18>_>::~allocator
            ((allocator<vk::Handle<(vk::HandleType)18>_> *)&createInfo.field_0x8f);
  createInfo.pNext._0_4_ = (uint)(1 < vertexInputBindingDescription.stride) * 2;
  local_3d0 = (undefined1  [4])0x1c;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._4_4_ = 2;
  createInfo._16_8_ =
       &graphicsPipelineInfos.
        super__Vector_base<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  createInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)&pipelineInputAssemblyStateInfo.primitiveRestartEnable;
  createInfo.pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)&viewport.minDepth;
  createInfo.pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  createInfo.pTessellationState = (VkPipelineTessellationStateCreateInfo *)local_120;
  createInfo.pViewportState =
       (VkPipelineViewportStateCreateInfo *)&pipelineMultisampleStateInfo.alphaToCoverageEnable;
  createInfo.pRasterizationState =
       (VkPipelineRasterizationStateCreateInfo *)&stencilOpState.writeMask;
  createInfo.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)local_220;
  createInfo.pDepthStencilState = (VkPipelineDepthStencilStateCreateInfo *)local_280;
  createInfo.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  createInfo.renderPass.m_internal._0_4_ = 0;
  createInfo.pDynamicState = (VkPipelineDynamicStateCreateInfo *)pipelineLayout.m_internal;
  createInfo.layout.m_internal = renderPass.m_internal;
  createInfo.basePipelineIndex = (int)createInfo.pNext;
  ::vk::Handle<(vk::HandleType)18>::Handle((Handle<(vk::HandleType)18> *)&createInfo.subpass,0);
  createInfo.basePipelineHandle.m_internal._0_4_ = 0xffffffff;
  std::vector<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>::
  push_back((vector<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
             *)local_300,(value_type *)local_3d0);
  createInfo.pNext._0_4_ = 4;
  createInfo.basePipelineHandle.m_internal._0_4_ = 0;
  for (local_3d4 = 1; pVVar1 = stack0xffffffffffffffc0,
      local_3d4 < vertexInputBindingDescription.stride; local_3d4 = local_3d4 + 1) {
    createInfo.renderPass.m_internal._0_4_ = local_3d4;
    std::vector<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
    ::push_back((vector<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
                 *)local_300,(value_type *)local_3d0);
  }
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_3e0,0);
  sVar5 = std::
          vector<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
          ::size((vector<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
                  *)local_300);
  pvVar6 = std::
           vector<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
           ::operator[]((vector<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
                         *)local_300,0);
  pvVar7 = std::
           vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
           ::operator[]((vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                         *)local_330,0);
  result = (*vk->_vptr_DeviceInterface[0x30])
                     (vk,pVVar1,local_3e0.m_internal,sVar5 & 0xffffffff,pvVar6,0,(int)pvVar7);
  ::vk::checkResult(result,
                    "vk.createGraphicsPipelines(device, DE_NULL, static_cast<deUint32>(graphicsPipelineInfos.size()), &graphicsPipelineInfos[0], DE_NULL, &rawPipelines[0])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
                    ,0x132);
  it._M_current._7_1_ = 0;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::vector(__return_storage_ptr__);
  local_3f8._M_current =
       (Handle<(vk::HandleType)18> *)
       std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
       ::begin((vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                *)local_330);
  __gnu_cxx::
  __normal_iterator<vk::Handle<(vk::HandleType)18>const*,std::vector<vk::Handle<(vk::HandleType)18>,std::allocator<vk::Handle<(vk::HandleType)18>>>>
  ::__normal_iterator<vk::Handle<(vk::HandleType)18>*>
            ((__normal_iterator<vk::Handle<(vk::HandleType)18>const*,std::vector<vk::Handle<(vk::HandleType)18>,std::allocator<vk::Handle<(vk::HandleType)18>>>>
              *)&local_3f0,&local_3f8);
  while( true ) {
    local_400._M_current =
         (Handle<(vk::HandleType)18> *)
         std::
         vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>::
         end((vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
              *)local_330);
    bVar2 = __gnu_cxx::operator!=(&local_3f0,&local_400);
    if (!bVar2) break;
    pHVar8 = __gnu_cxx::
             __normal_iterator<const_vk::Handle<(vk::HandleType)18>_*,_std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>_>
             ::operator*(&local_3f0);
    local_440 = pHVar8->m_internal;
    local_438.m_internal =
         (deUint64)::vk::refdetails::check<vk::Handle<(vk::HandleType)18>>(local_440);
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::Deleter
              (&local_458,vk,stack0xffffffffffffffc0,(VkAllocationCallbacks *)0x0);
    deleter.m_device._0_4_ = (int)local_458.m_device;
    deleter.m_deviceIface = local_458.m_deviceIface;
    deleter.m_device._4_4_ = (int)((ulong)local_458.m_device >> 0x20);
    deleter.m_allocator = local_458.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>::Move<vk::Handle<(vk::HandleType)18>>
              ((Move<vk::Handle<(vk::HandleType)18>> *)&local_430,
               (Checked<vk::Handle<(vk::HandleType)18>_>)local_438.m_internal,deleter);
    pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)18>>
              ((_anonymous_namespace_ *)&local_410,&local_430);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::push_back(__return_storage_ptr__,&local_410);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::~SharedPtr(&local_410);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_430);
    __gnu_cxx::
    __normal_iterator<const_vk::Handle<(vk::HandleType)18>_*,_std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>_>
    ::operator++(&local_3f0);
  }
  it._M_current._7_1_ = 1;
  std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>::
  ~vector((vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
           *)local_330);
  std::vector<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>::
  ~vector((vector<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
           *)local_300);
  return __return_storage_ptr__;
}

Assistant:

std::vector<PipelineSp> makeGraphicsPipelines (const DeviceInterface&		vk,
											   const VkDevice				device,
											   const deUint32				numSubpasses,
											   const VkPipelineLayout		pipelineLayout,
											   const VkRenderPass			renderPass,
											   const VkShaderModule			vertexModule,
											   const VkShaderModule			fragmentModule,
											   const IVec2					renderSize,
											   const VkSampleCountFlagBits	numSamples,
											   const VkPrimitiveTopology	topology)
{
	const VkVertexInputBindingDescription vertexInputBindingDescription =
	{
		0u,								// uint32_t				binding;
		sizeof(Vertex4RGBA),			// uint32_t				stride;
		VK_VERTEX_INPUT_RATE_VERTEX,	// VkVertexInputRate	inputRate;
	};

	const VkVertexInputAttributeDescription vertexInputAttributeDescriptions[] =
	{
		{
			0u,									// uint32_t			location;
			0u,									// uint32_t			binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,		// VkFormat			format;
			0u,									// uint32_t			offset;
		},
		{
			1u,									// uint32_t			location;
			0u,									// uint32_t			binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,		// VkFormat			format;
			sizeof(Vec4),						// uint32_t			offset;
		},
	};

	const VkPipelineVertexInputStateCreateInfo vertexInputStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineVertexInputStateCreateFlags)0,						// VkPipelineVertexInputStateCreateFlags       flags;
		1u,																// uint32_t                                    vertexBindingDescriptionCount;
		&vertexInputBindingDescription,									// const VkVertexInputBindingDescription*      pVertexBindingDescriptions;
		DE_LENGTH_OF_ARRAY(vertexInputAttributeDescriptions),			// uint32_t                                    vertexAttributeDescriptionCount;
		vertexInputAttributeDescriptions,								// const VkVertexInputAttributeDescription*    pVertexAttributeDescriptions;
	};

	const VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineInputAssemblyStateCreateFlags)0,						// VkPipelineInputAssemblyStateCreateFlags     flags;
		topology,														// VkPrimitiveTopology                         topology;
		VK_FALSE,														// VkBool32                                    primitiveRestartEnable;
	};

	const VkViewport viewport = makeViewport(
		0.0f, 0.0f,
		static_cast<float>(renderSize.x()), static_cast<float>(renderSize.y()),
		0.0f, 1.0f);

	const VkRect2D scissor = {
		makeOffset2D(0, 0),
		makeExtent2D(renderSize.x(), renderSize.y()),
	};

	const VkPipelineViewportStateCreateInfo pipelineViewportStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,			// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineViewportStateCreateFlags)0,							// VkPipelineViewportStateCreateFlags          flags;
		1u,																// uint32_t                                    viewportCount;
		&viewport,														// const VkViewport*                           pViewports;
		1u,																// uint32_t                                    scissorCount;
		&scissor,														// const VkRect2D*                             pScissors;
	};

	const VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,		// VkStructureType                          sType;
		DE_NULL,														// const void*                              pNext;
		(VkPipelineRasterizationStateCreateFlags)0,						// VkPipelineRasterizationStateCreateFlags  flags;
		VK_FALSE,														// VkBool32                                 depthClampEnable;
		VK_FALSE,														// VkBool32                                 rasterizerDiscardEnable;
		VK_POLYGON_MODE_FILL,											// VkPolygonMode							polygonMode;
		VK_CULL_MODE_NONE,												// VkCullModeFlags							cullMode;
		VK_FRONT_FACE_COUNTER_CLOCKWISE,								// VkFrontFace								frontFace;
		VK_FALSE,														// VkBool32									depthBiasEnable;
		0.0f,															// float									depthBiasConstantFactor;
		0.0f,															// float									depthBiasClamp;
		0.0f,															// float									depthBiasSlopeFactor;
		1.0f,															// float									lineWidth;
	};

	const VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,		// VkStructureType							sType;
		DE_NULL,														// const void*								pNext;
		(VkPipelineMultisampleStateCreateFlags)0,						// VkPipelineMultisampleStateCreateFlags	flags;
		numSamples,														// VkSampleCountFlagBits					rasterizationSamples;
		VK_FALSE,														// VkBool32									sampleShadingEnable;
		0.0f,															// float									minSampleShading;
		DE_NULL,														// const VkSampleMask*						pSampleMask;
		VK_FALSE,														// VkBool32									alphaToCoverageEnable;
		VK_FALSE														// VkBool32									alphaToOneEnable;
	};

	const VkStencilOpState stencilOpState = makeStencilOpState(
		VK_STENCIL_OP_KEEP,				// stencil fail
		VK_STENCIL_OP_KEEP,				// depth & stencil pass
		VK_STENCIL_OP_KEEP,				// depth only fail
		VK_COMPARE_OP_ALWAYS,			// compare op
		0u,								// compare mask
		0u,								// write mask
		0u);							// reference

	VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,		// VkStructureType							sType;
		DE_NULL,														// const void*								pNext;
		(VkPipelineDepthStencilStateCreateFlags)0,						// VkPipelineDepthStencilStateCreateFlags	flags;
		VK_FALSE,														// VkBool32									depthTestEnable;
		VK_FALSE,														// VkBool32									depthWriteEnable;
		VK_COMPARE_OP_LESS,												// VkCompareOp								depthCompareOp;
		VK_FALSE,														// VkBool32									depthBoundsTestEnable;
		VK_FALSE,														// VkBool32									stencilTestEnable;
		stencilOpState,													// VkStencilOpState							front;
		stencilOpState,													// VkStencilOpState							back;
		0.0f,															// float									minDepthBounds;
		1.0f,															// float									maxDepthBounds;
	};

	const VkColorComponentFlags colorComponentsAll = VK_COLOR_COMPONENT_R_BIT | VK_COLOR_COMPONENT_G_BIT | VK_COLOR_COMPONENT_B_BIT | VK_COLOR_COMPONENT_A_BIT;
	// Number of blend attachments must equal the number of color attachments during any subpass.
	const VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState =
	{
		VK_FALSE,						// VkBool32					blendEnable;
		VK_BLEND_FACTOR_ONE,			// VkBlendFactor			srcColorBlendFactor;
		VK_BLEND_FACTOR_ZERO,			// VkBlendFactor			dstColorBlendFactor;
		VK_BLEND_OP_ADD,				// VkBlendOp				colorBlendOp;
		VK_BLEND_FACTOR_ONE,			// VkBlendFactor			srcAlphaBlendFactor;
		VK_BLEND_FACTOR_ZERO,			// VkBlendFactor			dstAlphaBlendFactor;
		VK_BLEND_OP_ADD,				// VkBlendOp				alphaBlendOp;
		colorComponentsAll,				// VkColorComponentFlags	colorWriteMask;
	};

	const VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,		// VkStructureType								sType;
		DE_NULL,														// const void*									pNext;
		(VkPipelineColorBlendStateCreateFlags)0,						// VkPipelineColorBlendStateCreateFlags			flags;
		VK_FALSE,														// VkBool32										logicOpEnable;
		VK_LOGIC_OP_COPY,												// VkLogicOp									logicOp;
		1u,																// deUint32										attachmentCount;
		&pipelineColorBlendAttachmentState,								// const VkPipelineColorBlendAttachmentState*	pAttachments;
		{ 0.0f, 0.0f, 0.0f, 0.0f },										// float										blendConstants[4];
	};

	const VkPipelineShaderStageCreateInfo pShaderStages[] =
	{
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,		// VkStructureType						sType;
			DE_NULL,													// const void*							pNext;
			(VkPipelineShaderStageCreateFlags)0,						// VkPipelineShaderStageCreateFlags		flags;
			VK_SHADER_STAGE_VERTEX_BIT,									// VkShaderStageFlagBits				stage;
			vertexModule,												// VkShaderModule						module;
			"main",														// const char*							pName;
			DE_NULL,													// const VkSpecializationInfo*			pSpecializationInfo;
		},
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,		// VkStructureType						sType;
			DE_NULL,													// const void*							pNext;
			(VkPipelineShaderStageCreateFlags)0,						// VkPipelineShaderStageCreateFlags		flags;
			VK_SHADER_STAGE_FRAGMENT_BIT,								// VkShaderStageFlagBits				stage;
			fragmentModule,												// VkShaderModule						module;
			"main",														// const char*							pName;
			DE_NULL,													// const VkSpecializationInfo*			pSpecializationInfo;
		}
	};

	DE_ASSERT(numSubpasses > 0u);

	std::vector<VkGraphicsPipelineCreateInfo>	graphicsPipelineInfos	(0);
	std::vector<VkPipeline>						rawPipelines			(numSubpasses, DE_NULL);

	{
		const VkPipelineCreateFlags firstPipelineFlags = (numSubpasses > 1u ? VK_PIPELINE_CREATE_ALLOW_DERIVATIVES_BIT
																			: (VkPipelineCreateFlagBits)0);

		VkGraphicsPipelineCreateInfo createInfo =
		{
			VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,	// VkStructureType									sType;
			DE_NULL,											// const void*										pNext;
			firstPipelineFlags,									// VkPipelineCreateFlags							flags;
			DE_LENGTH_OF_ARRAY(pShaderStages),					// deUint32											stageCount;
			pShaderStages,										// const VkPipelineShaderStageCreateInfo*			pStages;
			&vertexInputStateInfo,								// const VkPipelineVertexInputStateCreateInfo*		pVertexInputState;
			&pipelineInputAssemblyStateInfo,					// const VkPipelineInputAssemblyStateCreateInfo*	pInputAssemblyState;
			DE_NULL,											// const VkPipelineTessellationStateCreateInfo*		pTessellationState;
			&pipelineViewportStateInfo,							// const VkPipelineViewportStateCreateInfo*			pViewportState;
			&pipelineRasterizationStateInfo,					// const VkPipelineRasterizationStateCreateInfo*	pRasterizationState;
			&pipelineMultisampleStateInfo,						// const VkPipelineMultisampleStateCreateInfo*		pMultisampleState;
			&pipelineDepthStencilStateInfo,						// const VkPipelineDepthStencilStateCreateInfo*		pDepthStencilState;
			&pipelineColorBlendStateInfo,						// const VkPipelineColorBlendStateCreateInfo*		pColorBlendState;
			DE_NULL,											// const VkPipelineDynamicStateCreateInfo*			pDynamicState;
			pipelineLayout,										// VkPipelineLayout									layout;
			renderPass,											// VkRenderPass										renderPass;
			0u,													// deUint32											subpass;
			DE_NULL,											// VkPipeline										basePipelineHandle;
			-1,													// deInt32											basePipelineIndex;
		};

		graphicsPipelineInfos.push_back(createInfo);

		createInfo.flags				= VK_PIPELINE_CREATE_DERIVATIVE_BIT;
		createInfo.basePipelineIndex	= 0;

		for (deUint32 subpassNdx = 1u; subpassNdx < numSubpasses; ++subpassNdx)
		{
			createInfo.subpass = subpassNdx;
			graphicsPipelineInfos.push_back(createInfo);
		}
	}

	VK_CHECK(vk.createGraphicsPipelines(device, DE_NULL, static_cast<deUint32>(graphicsPipelineInfos.size()), &graphicsPipelineInfos[0], DE_NULL, &rawPipelines[0]));

	std::vector<PipelineSp>	pipelines;

	for (std::vector<VkPipeline>::const_iterator it = rawPipelines.begin(); it != rawPipelines.end(); ++it)
		pipelines.push_back(makeSharedPtr(Move<VkPipeline>(check<VkPipeline>(*it), Deleter<VkPipeline>(vk, device, DE_NULL))));

	return pipelines;
}